

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O0

float parseFloat(char *p,char **end,char *endLine)

{
  char *pcVar1;
  char *in_RDX;
  char **in_RSI;
  char *in_RDI;
  bool bVar2;
  float fVar3;
  double dVar4;
  int exp_s;
  int exp_acc;
  int num_dec;
  float acc;
  int s;
  bool endLine_is_null;
  char *start;
  bool local_48;
  bool local_46;
  bool local_44;
  bool local_42;
  int local_40;
  int local_3c;
  int local_38;
  float local_34;
  int local_30;
  char *local_10;
  float local_4;
  
  bVar2 = in_RDX == (char *)0x0;
  if (*in_RDI == '\0') {
    *in_RSI = in_RDI;
    local_4 = 0.0;
  }
  else {
    local_30 = 1;
    local_10 = in_RDI;
    while( true ) {
      local_42 = false;
      if (*local_10 == ' ') {
        local_42 = bVar2 || local_10 < in_RDX;
      }
      if (!local_42) break;
      local_10 = local_10 + 1;
    }
    if (*local_10 == '-') {
      local_30 = -1;
      local_10 = local_10 + 1;
    }
    local_34 = 0.0;
    while( true ) {
      local_44 = false;
      if (('/' < *local_10) && (local_44 = false, *local_10 < ':')) {
        local_44 = bVar2 || local_10 < in_RDX;
      }
      if (!local_44) break;
      local_34 = (local_34 * 10.0 + (float)(int)*local_10) - 48.0;
      local_10 = local_10 + 1;
    }
    local_38 = 0;
    if (*local_10 == '.') {
      while( true ) {
        pcVar1 = local_10 + 1;
        local_46 = false;
        if (('/' < local_10[1]) && (local_46 = false, *pcVar1 < ':')) {
          local_46 = bVar2 || pcVar1 < in_RDX;
        }
        local_10 = pcVar1;
        if (!local_46) break;
        if (local_38 < 0x23) {
          local_34 = local_34 * 10.0 + (float)(*pcVar1 + -0x30);
          local_38 = local_38 + 1;
        }
      }
    }
    local_3c = 0;
    if (((*local_10 == 'e') || (*local_10 == 'E')) && ((bVar2 || (local_10 < in_RDX)))) {
      pcVar1 = local_10 + 1;
      local_40 = 1;
      if ((*pcVar1 == '-') && ((bVar2 || (pcVar1 < in_RDX)))) {
        local_40 = -1;
        pcVar1 = local_10 + 2;
      }
      while( true ) {
        local_10 = pcVar1;
        local_48 = false;
        if (('/' < *local_10) && (local_48 = false, *local_10 < ':')) {
          local_48 = bVar2 || local_10 < in_RDX;
        }
        if (!local_48) break;
        local_3c = local_3c * 10 + (int)*local_10 + -0x30;
        pcVar1 = local_10 + 1;
      }
      local_3c = local_40 * local_3c;
    }
    if ((((*local_10 == ' ') || (*local_10 == '\n')) || (*local_10 == '\t')) || (local_10 == in_RDX)
       ) {
      fVar3 = powf(10.0,(float)(local_3c - local_38));
      *in_RSI = local_10;
      local_4 = (float)local_30 * fVar3 * local_34;
    }
    else {
      dVar4 = strtod(in_RDI,in_RSI);
      local_4 = (float)dVar4;
    }
  }
  return local_4;
}

Assistant:

inline float parseFloat(char* p, char** end, char* endLine = nullptr)
{
  char* start = p;
  bool endLine_is_null = endLine == nullptr;

  if (!*p)
  {
    *end = p;
    return 0;
  }
  int s = 1;
  while ((*p == ' ') && (endLine_is_null || p < endLine)) p++;

  if (*p == '-')
  {
    s = -1;
    p++;
  }

  float acc = 0;
  while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) acc = acc * 10 + *p++ - '0';

  int num_dec = 0;
  if (*p == '.')
  {
    while (*(++p) >= '0' && *p <= '9' && (endLine_is_null || p < endLine))
    {
      if (num_dec < 35)
      {
        acc = acc * 10 + (*p - '0');
        num_dec++;
      }
    }
  }

  int exp_acc = 0;
  if ((*p == 'e' || *p == 'E') && (endLine_is_null || p < endLine))
  {
    p++;
    int exp_s = 1;
    if (*p == '-' && (endLine_is_null || p < endLine))
    {
      exp_s = -1;
      p++;
    }
    while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) exp_acc = exp_acc * 10 + *p++ - '0';
    exp_acc *= exp_s;
  }
  if (*p == ' ' || *p == '\n' || *p == '\t' || p == endLine)  // easy case succeeded.
  {
    acc *= powf(10, (float)(exp_acc - num_dec));
    *end = p;
    return s * acc;
  }
  else
    return (float)strtod(start, end);
}